

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

ExpectedValue * spectest::GetLane(ExpectedValue *__return_storage_ptr__,ExpectedValue *ev,int lane)

{
  Type TVar1;
  byte bVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  unsigned_long uVar6;
  v128 local_28;
  
  iVar4 = LaneCountFromType(ev->lane_type);
  if ((ev->value).type.enum_ != V128) {
    __assert_fail("ev.value.type == Type::V128",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/spectest-interp.cc"
                  ,0xc1,"ExpectedValue spectest::GetLane(const ExpectedValue &, int)");
  }
  if (iVar4 <= lane) {
    __assert_fail("lane < lane_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/spectest-interp.cc"
                  ,0xc2,"ExpectedValue spectest::GetLane(const ExpectedValue &, int)");
  }
  (__return_storage_ptr__->value).value.field_0.i64_ = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->value).value.field_0 + 8) = 0;
  TVar1 = ev->lane_type;
  (__return_storage_ptr__->value).type.enum_ = TVar1.enum_;
  (__return_storage_ptr__->value).type.type_index_ = TVar1.type_index_;
  local_28.v._0_8_ = (ev->value).value.field_0.i64_;
  local_28.v._8_8_ = *(undefined8 *)((long)&(ev->value).value.field_0 + 8);
  switch(TVar1.enum_) {
  case I16:
    __return_storage_ptr__->nan[0] = None;
    uVar3 = v128::To<unsigned_short>(&local_28,lane);
    uVar5 = (uint)uVar3;
    goto LAB_001187da;
  case I8:
    __return_storage_ptr__->nan[0] = None;
    bVar2 = v128::To<unsigned_char>(&local_28,lane);
    uVar5 = (uint)bVar2;
    goto LAB_001187da;
  default:
    abort();
  case F64:
    __return_storage_ptr__->nan[0] = ev->nan[lane];
    goto LAB_001187b5;
  case F32:
    __return_storage_ptr__->nan[0] = ev->nan[lane];
    break;
  case I64:
    __return_storage_ptr__->nan[0] = None;
LAB_001187b5:
    uVar6 = v128::To<unsigned_long>(&local_28,lane);
    (__return_storage_ptr__->value).value.field_0.i64_ = uVar6;
    return __return_storage_ptr__;
  case I32:
    __return_storage_ptr__->nan[0] = None;
  }
  uVar5 = v128::To<unsigned_int>(&local_28,lane);
LAB_001187da:
  (__return_storage_ptr__->value).value.field_0.i32_ = uVar5;
  return __return_storage_ptr__;
}

Assistant:

ExpectedValue GetLane(const ExpectedValue& ev, int lane) {
  int lane_count = LaneCountFromType(ev.lane_type);
  assert(ev.value.type == Type::V128);
  assert(lane < lane_count);

  ExpectedValue result;
  result.value.type = ev.lane_type;

  v128 vec = ev.value.value.Get<v128>();

  switch (ev.lane_type) {
    case Type::I8:
      result.nan[0] = ExpectedNan::None;
      result.value.value.Set<u32>(vec.u8(lane));
      break;

    case Type::I16:
      result.nan[0] = ExpectedNan::None;
      result.value.value.Set<u32>(vec.u16(lane));
      break;

    case Type::I32:
      result.nan[0] = ExpectedNan::None;
      result.value.value.Set<u32>(vec.u32(lane));
      break;

    case Type::I64:
      result.nan[0] = ExpectedNan::None;
      result.value.value.Set<u64>(vec.u64(lane));
      break;

    case Type::F32:
      result.nan[0] = ev.nan[lane];
      result.value.value.Set<f32>(Bitcast<f32>(vec.f32_bits(lane)));
      break;

    case Type::F64:
      result.nan[0] = ev.nan[lane];
      result.value.value.Set<f64>(Bitcast<f64>(vec.f64_bits(lane)));
      break;

    default:
      WABT_UNREACHABLE;
  }
  return result;
}